

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_ls.c
# Opt level: O0

int KINGetJacNumIters(void *kinmem,long *nni_J)

{
  undefined8 *in_RSI;
  int retval;
  KINLsMem kinls_mem;
  KINMem kin_mem;
  KINMem *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  void *in_stack_ffffffffffffffd8;
  undefined8 local_20;
  undefined4 local_4;
  
  local_4 = kinLs_AccessLMem(in_stack_ffffffffffffffd8,
                             (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                             in_stack_ffffffffffffffc8,(KINLsMem *)0x115be9);
  if (local_4 == 0) {
    *in_RSI = *(undefined8 *)(local_20 + 0xe0);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int KINGetJacNumIters(void* kinmem, long int* nni_J)
{
  KINMem kin_mem;
  KINLsMem kinls_mem;
  int retval;

  /* access KINLsMem structure; set output and return */
  retval = kinLs_AccessLMem(kinmem, __func__, &kin_mem, &kinls_mem);
  if (retval != KINLS_SUCCESS) { return retval; }
  *nni_J = kin_mem->kin_nnilset;
  return KINLS_SUCCESS;
}